

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall efsw::String::String(String *this,wstring *wideString)

{
  char32_t *pcVar1;
  char32_t *pcVar2;
  
  (this->mString)._M_dataplus._M_p = (pointer)&(this->mString).field_2;
  (this->mString)._M_string_length = 0;
  (this->mString).field_2._M_local_buf[0] = L'\0';
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  reserve(&this->mString,wideString->_M_string_length + 1);
  if (0 < (long)wideString->_M_string_length) {
    pcVar2 = (wideString->_M_dataplus)._M_p;
    pcVar1 = pcVar2 + wideString->_M_string_length;
    do {
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      push_back(&this->mString,*pcVar2);
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 < pcVar1);
  }
  return;
}

Assistant:

String::String( const std::wstring& wideString ) {
	mString.reserve( wideString.length() + 1 );
	Utf32::FromWide( wideString.begin(), wideString.end(), std::back_inserter( mString ) );
}